

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::objectivec::MessageGenerator::GenerateStaticVariablesInitialization
          (MessageGenerator *this,Printer *printer)

{
  pointer ppEVar1;
  pointer ppMVar2;
  
  ppEVar1 = (this->extension_generators_).
            super__Vector_base<google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppEVar1 !=
      (this->extension_generators_).
      super__Vector_base<google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      ExtensionGenerator::GenerateStaticVariablesInitialization(*ppEVar1,printer);
      ppEVar1 = ppEVar1 + 1;
    } while (ppEVar1 !=
             (this->extension_generators_).
             super__Vector_base<google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  for (ppMVar2 = (this->nested_message_generators_).
                 super__Vector_base<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppMVar2 !=
      (this->nested_message_generators_).
      super__Vector_base<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppMVar2 = ppMVar2 + 1) {
    GenerateStaticVariablesInitialization(*ppMVar2,printer);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateStaticVariablesInitialization(
    io::Printer* printer) {
  for (vector<ExtensionGenerator*>::iterator iter =
           extension_generators_.begin();
       iter != extension_generators_.end(); ++iter) {
    (*iter)->GenerateStaticVariablesInitialization(printer);
  }

  for (vector<MessageGenerator*>::iterator iter =
           nested_message_generators_.begin();
       iter != nested_message_generators_.end(); ++iter) {
    (*iter)->GenerateStaticVariablesInitialization(printer);
  }
}